

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Instruction i;
  
  switch(var->k) {
  case VLOCAL:
    if ((ex->k == VNONRELOC) && (iVar2 = (ex->u).info, iVar3 = luaY_nvarstack(fs), iVar3 <= iVar2))
    {
      fs->freereg = fs->freereg + 0xff;
    }
    exp2reg(fs,ex,(uint)(var->u).var.ridx);
    return;
  case VUPVAL:
    iVar2 = luaK_exp2anyreg(fs,ex);
    i = (var->u).info << 0x10 | iVar2 << 7 | 10;
    break;
  default:
    goto switchD_0011bc87_caseD_b;
  case VINDEXED:
    bVar1 = (var->u).ind.t;
    iVar2 = (var->u).info;
    iVar3 = exp2RK(fs,ex);
    i = iVar3 << 0xf | (ex->u).info << 0x18 | iVar2 << 0x10 | (uint)bVar1 << 7 | 0x10;
    break;
  case VINDEXUP:
    bVar1 = (var->u).ind.t;
    iVar2 = (var->u).info;
    iVar3 = exp2RK(fs,ex);
    i = iVar3 << 0xf | (ex->u).info << 0x18 | iVar2 << 0x10 | (uint)bVar1 << 7 | 0xf;
    break;
  case VINDEXI:
    bVar1 = (var->u).ind.t;
    iVar2 = (var->u).info;
    iVar3 = exp2RK(fs,ex);
    i = iVar3 << 0xf | (ex->u).info << 0x18 | iVar2 << 0x10 | (uint)bVar1 << 7 | 0x11;
    break;
  case VINDEXSTR:
    bVar1 = (var->u).ind.t;
    iVar2 = (var->u).info;
    iVar3 = exp2RK(fs,ex);
    i = iVar3 << 0xf | (ex->u).info << 0x18 | iVar2 << 0x10 | (uint)bVar1 << 7 | 0x12;
  }
  luaK_code(fs,i);
switchD_0011bc87_caseD_b:
  if ((ex->k == VNONRELOC) && (iVar2 = (ex->u).info, iVar3 = luaY_nvarstack(fs), iVar3 <= iVar2)) {
    fs->freereg = fs->freereg + 0xff;
  }
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.var.ridx);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      luaK_codeABC(fs, OP_SETUPVAL, e, var->u.info, 0);
      break;
    }
    case VINDEXUP: {
      codeABRK(fs, OP_SETTABUP, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXI: {
      codeABRK(fs, OP_SETI, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXSTR: {
      codeABRK(fs, OP_SETFIELD, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    case VINDEXED: {
      codeABRK(fs, OP_SETTABLE, var->u.ind.t, var->u.ind.idx, ex);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}